

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CS248::Application::cursor_event(Application *this,float x,float y)

{
  if (this->leftDown == true) {
    if ((this->middleDown == false) && (this->rightDown == false)) {
      Camera::rotateBy(&this->camera,
                       (3.141592653589793 /
                       (((double)CONCAT44(0x45300000,(int)(this->screenH >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->screenH) - 4503599627370496.0))) *
                       (double)(y - this->mouseY),
                       (3.141592653589793 /
                       (((double)CONCAT44(0x45300000,(int)(this->screenW >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->screenW) - 4503599627370496.0))) *
                       (double)(x - this->mouseX));
    }
  }
  else if ((this->middleDown == false) && (this->rightDown == true)) {
    Camera::moveBy(&this->camera,(double)-(x - this->mouseX),(double)(y - this->mouseY),
                   this->canonicalViewDistance);
  }
  this->mouseX = x;
  this->mouseY = y;
  return;
}

Assistant:

void Application::cursor_event(float x, float y) {
    if (leftDown && !middleDown && !rightDown) {
        mouse1_dragged(x, y);
    } else if (!leftDown && !middleDown && rightDown) {
        mouse2_dragged(x, y);
    } else if (!leftDown && !middleDown && !rightDown) {
        mouse_moved(x, y);
    }

    mouseX = x;
    mouseY = y;
}